

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::getReducedSolution
          (InverseKinematics *this,MatrixView<double> *baseTransformSolution,
          Span<double,__1L> shapeSolution)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return false;
}

Assistant:

bool InverseKinematics::getReducedSolution(iDynTree::MatrixView<double> baseTransformSolution,
                                               iDynTree::Span<double> shapeSolution)
    {
#ifdef IDYNTREE_USES_IPOPT
        bool ok = shapeSolution.size() == IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints.size();
        if (!ok)
        {
            reportError("InveseKineamtics",
                        "getReducedSolution",
                        "Invalid size of the shapeSolution vector");
            return false;
        }

        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        ok = (baseTransformSolution.rows() == expected_transform_rows)
            && (baseTransformSolution.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "getReducedSolution",
                        "Invalid size of the baseTransformSolution vector");
            return false;
        }

        assert(m_pimpl);
        toEigen(baseTransformSolution) = toEigen(IK_PIMPL(m_pimpl)->m_baseResults.asHomogeneousTransform());
        assert(shapeSolution.size() == IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints.size());
        for (size_t i = 0; i < shapeSolution.size(); ++i) {
            shapeSolution(i) = IK_PIMPL(m_pimpl)->m_jointsResults(IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints[i]);
        }
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }